

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Dwarf.h
# Opt level: O1

bool llvm::dwarf::isType(Tag T)

{
  bool bVar1;
  bool bVar2;
  int iVar3;
  undefined6 in_register_0000003a;
  
  bVar1 = false;
  iVar3 = (int)CONCAT62(in_register_0000003a,T);
  bVar2 = bVar1;
  if (iVar3 < 0x31) {
    bVar2 = false;
    switch(iVar3) {
    case 1:
    case 2:
    case 4:
    case 0xf:
    case 0x10:
    case 0x12:
    case 0x13:
    case 0x15:
    case 0x16:
    case 0x17:
      goto switchD_00d9d7bb_caseD_1;
    case 3:
    case 5:
    case 6:
    case 7:
    case 8:
    case 9:
    case 10:
    case 0xb:
    case 0xc:
    case 0xd:
    case 0xe:
    case 0x11:
    case 0x14:
      goto switchD_00d9d7bb_caseD_3;
    default:
      bVar2 = bVar1;
      switch(iVar3) {
      case 0x1f:
      case 0x21:
      case 0x24:
      case 0x26:
      case 0x29:
      case 0x2d:
        goto switchD_00d9d7bb_caseD_1;
      default:
        goto switchD_00d9d7bb_caseD_3;
      }
    }
  }
  switch(iVar3) {
  case 0x31:
  case 0x35:
  case 0x37:
  case 0x38:
  case 0x3b:
  case 0x40:
  case 0x42:
  case 0x44:
  case 0x46:
  case 0x47:
  case 0x4b:
switchD_00d9d7bb_caseD_1:
    bVar2 = true;
    break;
  case 0x32:
  case 0x33:
  case 0x34:
  case 0x36:
  case 0x39:
  case 0x3a:
  case 0x3c:
  case 0x3d:
  case 0x3e:
  case 0x3f:
  case 0x41:
  case 0x43:
  case 0x45:
  case 0x48:
  case 0x49:
  case 0x4a:
    break;
  default:
    switch(iVar3) {
    case 0xb001:
    case 0xb002:
    case 0xb003:
    case 0xb004:
      goto switchD_00d9d7bb_caseD_1;
    default:
      break;
    }
  }
switchD_00d9d7bb_caseD_3:
  return bVar2;
}

Assistant:

inline bool isType(Tag T) {
  switch (T) {
  default:
    return false;
#define HANDLE_DW_TAG(ID, NAME, VERSION, VENDOR, KIND)                         \
  case DW_TAG_##NAME:                                                          \
    return (KIND == DW_KIND_TYPE);
#include "llvm/BinaryFormat/Dwarf.def"
  }
}